

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlChar * xmlNodeGetContent(xmlNode *cur)

{
  xmlChar *pxVar1;
  xmlEntityPtr pxVar2;
  xmlBufPtr buf;
  
  if (cur == (xmlNode *)0x0) {
    return (xmlChar *)0x0;
  }
  switch(cur->type) {
  case XML_ELEMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
    buf = xmlBufCreateSize(0x40);
    goto LAB_00187196;
  case XML_ATTRIBUTE_NODE:
    pxVar1 = xmlGetPropNodeValueInternal((xmlAttr *)cur);
    return pxVar1;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    pxVar1 = cur->content;
    if (pxVar1 != (xmlChar *)0x0) goto LAB_00187167;
    break;
  case XML_ENTITY_REF_NODE:
    pxVar2 = xmlGetDocEntity(cur->doc,cur->name);
    if (pxVar2 == (xmlEntityPtr)0x0) {
      return (xmlChar *)0x0;
    }
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    buf = xmlBufCreate();
LAB_00187196:
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
      xmlBufGetNodeContent(buf,cur);
      pxVar1 = xmlBufDetach(buf);
      xmlBufFree(buf);
      return pxVar1;
    }
    break;
  case XML_NAMESPACE_DECL:
    pxVar1 = cur->name;
LAB_00187167:
    pxVar1 = xmlStrdup(pxVar1);
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlNodeGetContent(const xmlNode *cur)
{
    if (cur == NULL)
        return (NULL);
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:{
                xmlBufPtr buf;
                xmlChar *ret;

                buf = xmlBufCreateSize(64);
                if (buf == NULL)
                    return (NULL);
                xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
		xmlBufGetNodeContent(buf, cur);
                ret = xmlBufDetach(buf);
                xmlBufFree(buf);
                return (ret);
            }
        case XML_ATTRIBUTE_NODE:
	    return(xmlGetPropNodeValueInternal((xmlAttrPtr) cur));
        case XML_COMMENT_NODE:
        case XML_PI_NODE:
            if (cur->content != NULL)
                return (xmlStrdup(cur->content));
            return (NULL);
        case XML_ENTITY_REF_NODE:{
                xmlEntityPtr ent;
                xmlBufPtr buf;
                xmlChar *ret;

                /* lookup entity declaration */
                ent = xmlGetDocEntity(cur->doc, cur->name);
                if (ent == NULL)
                    return (NULL);

                buf = xmlBufCreate();
                if (buf == NULL)
                    return (NULL);
                xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

                xmlBufGetNodeContent(buf, cur);

                ret = xmlBufDetach(buf);
                xmlBufFree(buf);
                return (ret);
            }
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            return (NULL);
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE: {
	    xmlBufPtr buf;
	    xmlChar *ret;

	    buf = xmlBufCreate();
	    if (buf == NULL)
		return (NULL);
            xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

	    xmlBufGetNodeContent(buf, (xmlNodePtr) cur);

	    ret = xmlBufDetach(buf);
	    xmlBufFree(buf);
	    return (ret);
	}
        case XML_NAMESPACE_DECL: {
	    xmlChar *tmp;

	    tmp = xmlStrdup(((xmlNsPtr) cur)->href);
            return (tmp);
	}
        case XML_ELEMENT_DECL:
            /* TODO !!! */
            return (NULL);
        case XML_ATTRIBUTE_DECL:
            /* TODO !!! */
            return (NULL);
        case XML_ENTITY_DECL:
            /* TODO !!! */
            return (NULL);
        case XML_CDATA_SECTION_NODE:
        case XML_TEXT_NODE:
            if (cur->content != NULL)
                return (xmlStrdup(cur->content));
            return (NULL);
    }
    return (NULL);
}